

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_GetGlyphKernAdvance(stbtt_fontinfo *info,int glyph1,int glyph2)

{
  int iVar1;
  uchar *puVar2;
  stbtt_uint16 sVar3;
  stbtt_int16 sVar4;
  uint uVar5;
  int iVar6;
  stbtt_uint32 sVar7;
  int local_38;
  int m;
  int r;
  int l;
  stbtt_uint32 straw;
  stbtt_uint32 needle;
  stbtt_uint8 *data;
  int glyph2_local;
  int glyph1_local;
  stbtt_fontinfo *info_local;
  
  puVar2 = info->data;
  iVar1 = info->kern;
  if (((info->kern != 0) && (sVar3 = ttUSHORT(puVar2 + (long)iVar1 + 2), sVar3 != 0)) &&
     (sVar3 = ttUSHORT(puVar2 + (long)iVar1 + 8), sVar3 == 1)) {
    m = 0;
    sVar3 = ttUSHORT(puVar2 + (long)iVar1 + 10);
    local_38 = sVar3 - 1;
    uVar5 = glyph1 << 0x10 | glyph2;
    while (m <= local_38) {
      iVar6 = m + local_38 >> 1;
      sVar7 = ttULONG(puVar2 + (long)(iVar6 * 6) + (long)iVar1 + 0x12);
      if (uVar5 < sVar7) {
        local_38 = iVar6 + -1;
      }
      else {
        if (uVar5 <= sVar7) {
          sVar4 = ttSHORT(puVar2 + (long)(iVar6 * 6) + (long)iVar1 + 0x16);
          return (int)sVar4;
        }
        m = iVar6 + 1;
      }
    }
  }
  return 0;
}

Assistant:

STBTT_DEF int  stbtt_GetGlyphKernAdvance(const stbtt_fontinfo *info, int glyph1, int glyph2)
{
   stbtt_uint8 *data = info->data + info->kern;
   stbtt_uint32 needle, straw;
   int l, r, m;

   // we only look at the first table. it must be 'horizontal' and format 0.
   if (!info->kern)
      return 0;
   if (ttUSHORT(data+2) < 1) // number of tables, need at least 1
      return 0;
   if (ttUSHORT(data+8) != 1) // horizontal flag must be set in format
      return 0;

   l = 0;
   r = ttUSHORT(data+10) - 1;
   needle = glyph1 << 16 | glyph2;
   while (l <= r) {
      m = (l + r) >> 1;
      straw = ttULONG(data+18+(m*6)); // note: unaligned read
      if (needle < straw)
         r = m - 1;
      else if (needle > straw)
         l = m + 1;
      else
         return ttSHORT(data+22+(m*6));
   }
   return 0;
}